

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_tests.cpp
# Opt level: O2

void __thiscall
peerman_tests::connections_desirable_service_flags::test_method
          (connections_desirable_service_flags *this)

{
  uint uVar1;
  long lVar2;
  pointer ppCVar3;
  Options opts;
  int iVar4;
  undefined4 extraout_var;
  Chainstate *pCVar5;
  undefined4 extraout_var_00;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ChainstateManager *pool;
  iterator pvVar7;
  CTxMemPool *warnings;
  iterator pvVar8;
  NodeContext *node;
  CBlockIndex *pCVar9;
  seconds block_time;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  check_type cVar12;
  undefined4 uVar10;
  undefined4 uVar11;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  __pthread_internal_list local_230;
  assertion_result local_220;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined2 uStack_1dc;
  undefined4 local_1d8;
  undefined1 local_1d0 [8];
  unique_lock<std::recursive_mutex> local_1c8;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  Params consensus;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pool = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman._M_t.
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  warnings = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  local_1e8 = 0;
  uStack_1e4 = 100;
  uStack_1e0 = 100;
  uStack_1dc = 0;
  local_1d8 = 2000;
  uVar11 = 2000;
  _cVar12 = (check_type)((ulong)CONCAT42(100,uStack_1e6) << 0x10);
  uVar10 = 100;
  opts._8_8_ = (undefined8)_cVar12;
  opts._0_8_ = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup
               .super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  opts.max_headers_result = 100;
  PeerManager::make((CConnman *)local_1d0,
                    (AddrMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.connman._M_t.
                    super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
                    super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
                    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl,
                    (BanMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)pool,(Warnings *)warnings,opts);
  Consensus::Params::Params
            (&consensus,
             &((((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
              chainparams)->consensus);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)warnings;
  msg.m_begin = (iterator)pool;
  file.m_end = &DAT_00000028;
  file.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_208,msg);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var,iVar4) == 9);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb675f;
  local_230.__next = (__pthread_internal_list *)0xbb67b9;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_238 = "";
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_240,0x28,uVar10,
             uVar11);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  pvVar7 = (iterator)0x2b;
  pvVar8 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_1c8,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
             ,0x2b,false);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar5->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar9 = (CBlockIndex *)0x0;
  }
  else {
    pCVar9 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_1c8);
  uVar1 = pCVar9->nTime;
  (*(*(_func_int ***)local_1d0)[0x12])(local_1d0,(ulong)(uint)pCVar9->nHeight,(ulong)uVar1);
  block_time.__r = (ulong)uVar1 + 1;
  SetMockTime(block_time.__r);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x31;
  file_00.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
             msg_00);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_00,iVar4) == 0x408);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb67ba;
  local_230.__next = (__pthread_internal_list *)0xbb681c;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_268 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_270,0x31);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  SetMockTime((seconds)(consensus.nPowTargetSpacing * 0x8f + (long)tVar6.__d.__r));
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0x35;
  file_01.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290,
             msg_01);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_01,iVar4) == 0x408);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb67ba;
  local_230.__next = (__pthread_internal_list *)0xbb681c;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_298 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_2a0,0x35);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  SetMockTime((seconds)((long)tVar6.__d.__r + consensus.nPowTargetSpacing * 2));
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x39;
  file_02.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c0,
             msg_02);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_02,iVar4) == 9);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb675f;
  local_230.__next = (__pthread_internal_list *)0xbb67b9;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_2c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_2d0,0x39);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  ValidationSignals::RegisterValidationInterface
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
             (CValidationInterface *)local_1d0);
  node = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node;
  mineBlock(node,block_time);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0x42;
  file_03.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
             msg_03);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_03,iVar4) == 9);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb675f;
  local_230.__next = (__pthread_internal_list *)0xbb67b9;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_2f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_300,0x42);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  mineBlock(node,tVar6.__d.__r);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0x46;
  file_04.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_320,
             msg_04);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_04,iVar4) == 0x408);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb67ba;
  local_230.__next = (__pthread_internal_list *)0xbb681c;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_328 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_330,0x46);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  SetMockTime((seconds)((long)tVar6.__d.__r + consensus.nPowTargetSpacing * 0x90 + 1));
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0x4a;
  file_05.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_350,
             msg_05);
  iVar4 = (*(*(_func_int ***)local_1d0)[0x17])(local_1d0,0x408);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(CONCAT44(extraout_var_05,iVar4) == 9);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230.__prev = (__pthread_internal_list *)0xbb675f;
  local_230.__next = (__pthread_internal_list *)0xbb67b9;
  local_1c8._M_owns = false;
  local_1c8._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/peerman_tests.cpp"
  ;
  local_358 = "";
  local_1b0 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_360,0x4a);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  Consensus::Params::~Params(&consensus);
  if (local_1d0 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_1d0)[0xb])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(connections_desirable_service_flags)
{
    std::unique_ptr<PeerManager> peerman = PeerManager::make(*m_node.connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});
    auto consensus = m_node.chainman->GetParams().GetConsensus();

    // Check we start connecting to full nodes
    ServiceFlags peer_flags{NODE_WITNESS | NODE_NETWORK_LIMITED};
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // Make peerman aware of the initial best block and verify we accept limited peers when we start close to the tip time.
    auto tip = WITH_LOCK(::cs_main, return m_node.chainman->ActiveChain().Tip());
    uint64_t tip_block_time = tip->GetBlockTime();
    int tip_block_height = tip->nHeight;
    peerman->SetBestBlock(tip_block_height, std::chrono::seconds{tip_block_time});

    SetMockTime(tip_block_time + 1); // Set node time to tip time
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Check we don't disallow limited peers connections when we are behind but still recoverable (below the connection safety window)
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * (NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS - 1)});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Check we disallow limited peers connections when we are further than the limited peers safety window
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * 2});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // By now, we tested that the connections desirable services flags change based on the node's time proximity to the tip.
    // Now, perform the same tests for when the node receives a block.
    m_node.validation_signals->RegisterValidationInterface(peerman.get());

    // First, verify a block in the past doesn't enable limited peers connections
    // At this point, our time is (NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS + 1) * 10 minutes ahead the tip's time.
    mineBlock(m_node, /*block_time=*/std::chrono::seconds{tip_block_time + 1});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // Verify a block close to the tip enables limited peers connections
    mineBlock(m_node, /*block_time=*/GetTime<std::chrono::seconds>());
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Lastly, verify the stale tip checks can disallow limited peers connections after not receiving blocks for a prolonged period.
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS + 1});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));
}